

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_encoder.hpp
# Opt level: O3

void __thiscall
jsoncons::csv::
basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
::basic_csv_encoder(basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                    *this,string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *sink,basic_csv_encode_options<char> *options,allocator<char> *alloc)

{
  _func_int **pp_Var1;
  pointer pcVar2;
  _func_int *p_Var3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  write_double *local_60;
  string_type *local_58;
  string_type *local_50;
  string_type *local_48;
  string_type *local_40;
  string_type *local_38;
  
  (this->super_basic_json_visitor<char>)._vptr_basic_json_visitor =
       (_func_int **)&PTR__basic_csv_encoder_00b34e48;
  (this->sink_).buf_ptr = (container_type *)0x0;
  (this->sink_).buf_ptr = sink->buf_ptr;
  sink->buf_ptr = (container_type *)0x0;
  pp_Var1 = options->_vptr_basic_csv_encode_options;
  this->flat_ = (bool)((&options->field_0xc)[(long)pp_Var1[-3]] & 1);
  this->max_nesting_depth_ = *(size_t *)(&options->field_0x108 + (long)pp_Var1[-3]);
  this->has_column_mapping_ =
       *(long *)(&options->field_0xf0 + (long)pp_Var1[-3]) !=
       *(long *)(&options->field_0xf8 + (long)pp_Var1[-3]);
  this->has_column_names_ = *(long *)(&options->field_0xd8 + (long)pp_Var1[-3]) != 0;
  this->field_delimiter_ = (&options->quote_style_)[(long)pp_Var1[-3]];
  this->subfield_delimiter_ = (&options->field_0xb)[(long)pp_Var1[-3]];
  (this->line_delimiter_)._M_dataplus._M_p = (pointer)&(this->line_delimiter_).field_2;
  pcVar2 = (options->line_delimiter_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->line_delimiter_,pcVar2,
             pcVar2 + (options->line_delimiter_)._M_string_length);
  this->quote_style_ = options->quote_style_;
  pp_Var1 = options->_vptr_basic_csv_encode_options;
  this->quote_char_ = (&options->float_format_)[(long)pp_Var1[-3]];
  this->quote_escape_char_ = (&options->precision_)[(long)pp_Var1[-3]];
  this->enable_nan_to_num_ = (bool)((byte)(&options->field_0xc)[(long)pp_Var1[-3]] >> 1 & 1);
  p_Var3 = pp_Var1[-3];
  (this->nan_to_num_)._M_dataplus._M_p = (pointer)&(this->nan_to_num_).field_2;
  lVar4 = *(long *)(p_Var3 + (long)&(options->line_delimiter_)._M_dataplus);
  local_38 = &this->line_delimiter_;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->nan_to_num_,lVar4,
             *(long *)(p_Var3 + 8 + (long)&(options->line_delimiter_)._M_dataplus) + lVar4);
  pp_Var1 = options->_vptr_basic_csv_encode_options;
  this->enable_nan_to_str_ = (bool)((byte)(&options->field_0xc)[(long)pp_Var1[-3]] >> 4 & 1);
  p_Var3 = pp_Var1[-3];
  (this->nan_to_str_)._M_dataplus._M_p = (pointer)&(this->nan_to_str_).field_2;
  local_40 = &this->nan_to_num_;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->nan_to_str_,*(long *)(&options->field_0x70 + (long)p_Var3),
             *(long *)(&options->field_0x78 + (long)p_Var3) +
             *(long *)(&options->field_0x70 + (long)p_Var3));
  pp_Var1 = options->_vptr_basic_csv_encode_options;
  this->enable_inf_to_num_ = (bool)((byte)(&options->field_0xc)[(long)pp_Var1[-3]] >> 2 & 1);
  local_50 = &this->inf_to_num_;
  p_Var3 = pp_Var1[-3];
  (this->inf_to_num_)._M_dataplus._M_p = (pointer)&(this->inf_to_num_).field_2;
  local_48 = &this->nan_to_str_;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,*(long *)(&options->field_0x30 + (long)p_Var3),
             *(long *)(&options->field_0x38 + (long)p_Var3) +
             *(long *)(&options->field_0x30 + (long)p_Var3));
  pp_Var1 = options->_vptr_basic_csv_encode_options;
  this->enable_inf_to_str_ = (bool)((byte)(&options->field_0xc)[(long)pp_Var1[-3]] >> 5 & 1);
  local_58 = &this->inf_to_str_;
  p_Var3 = pp_Var1[-3];
  (this->inf_to_str_)._M_dataplus._M_p = (pointer)&(this->inf_to_str_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,*(long *)(&options->field_0x90 + (long)p_Var3),
             *(long *)(&options->field_0x98 + (long)p_Var3) +
             *(long *)(&options->field_0x90 + (long)p_Var3));
  pp_Var1 = options->_vptr_basic_csv_encode_options;
  this->enable_neginf_to_num_ = (*(ushort *)(&options->field_0xc + (long)pp_Var1[-3]) & 0xc) != 0;
  basic_csv_options_common<char>::neginf_to_num_abi_cxx11_
            (&this->neginf_to_num_,
             (basic_csv_options_common<char> *)
             ((long)&options->_vptr_basic_csv_encode_options + (long)pp_Var1[-3]));
  pp_Var1 = options->_vptr_basic_csv_encode_options;
  this->enable_neginf_to_str_ = (*(ushort *)(&options->field_0xc + (long)pp_Var1[-3]) & 0x60) != 0;
  basic_csv_options_common<char>::neginf_to_str_abi_cxx11_
            (&this->neginf_to_str_,
             (basic_csv_options_common<char> *)
             ((long)&options->_vptr_basic_csv_encode_options + (long)pp_Var1[-3]));
  (this->stack_).
  super__Vector_base<jsoncons::csv::basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::stack_item>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stack_).
  super__Vector_base<jsoncons::csv::basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::stack_item>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stack_).
  super__Vector_base<jsoncons::csv::basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::csv::basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::stack_item>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60 = &this->fp_;
  jsoncons::detail::write_double::write_double
            (local_60,options->float_format_,(int)options->precision_);
  (this->column_paths_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->column_paths_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->column_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->column_paths_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->column_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->column_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->column_path_name_map_)._M_h._M_buckets =
       &(this->column_path_name_map_)._M_h._M_single_bucket;
  (this->column_path_name_map_)._M_h._M_bucket_count = 1;
  (this->column_path_name_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->column_path_name_map_)._M_h._M_element_count = 0;
  (this->column_path_name_map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->column_path_name_map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->column_path_name_map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->column_path_value_map_)._M_h._M_buckets =
       &(this->column_path_value_map_)._M_h._M_single_bucket;
  (this->column_path_value_map_)._M_h._M_bucket_count = 1;
  (this->column_path_value_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->column_path_value_map_)._M_h._M_element_count = 0;
  (this->column_path_value_map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->column_path_value_map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->column_path_value_map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->column_path_column_map_)._M_h._M_buckets =
       &(this->column_path_column_map_)._M_h._M_single_bucket;
  (this->column_path_column_map_)._M_h._M_bucket_count = 1;
  (this->column_path_column_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->column_path_column_map_)._M_h._M_element_count = 0;
  (this->column_path_column_map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->column_path_column_map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->column_path_column_map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->column_index_ = 0;
  (this->value_buffer_)._M_dataplus._M_p = (pointer)&(this->value_buffer_).field_2;
  (this->value_buffer_)._M_string_length = 0;
  (this->value_buffer_).field_2._M_local_buf[0] = '\0';
  (this->column_it_).
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true>
  ._M_cur = (__node_type *)0x0;
  if (this->has_column_mapping_ == true) {
    __args = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (&options->field_0xf0 + (long)options->_vptr_basic_csv_encode_options[-3]);
    pbVar5 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (&options->field_0xf8 + (long)options->_vptr_basic_csv_encode_options[-3]);
    if (__args != pbVar5) {
      do {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->column_paths_,__args);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::__cxx11::string_const&,std::__cxx11::string_const&>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&this->column_path_name_map_,__args,__args + 1);
        local_78 = 0;
        local_70 = 0;
        local_80 = &local_70;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::__cxx11::string_const&,std::__cxx11::string>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&this->column_path_value_map_,__args,&local_80);
        if (local_80 != &local_70) {
          operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
        }
        __args = __args + 2;
      } while (__args != pbVar5);
    }
  }
  if (this->has_column_names_ == true) {
    detail::
    parse_column_names<char,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (&options->field_0xd0 + (long)options->_vptr_basic_csv_encode_options[-3]),
               &this->column_names_);
  }
  return;
}

Assistant:

basic_csv_encoder(Sink&& sink,
        const basic_csv_encode_options<CharT>& options, 
        const Allocator& alloc = Allocator())
      : sink_(std::forward<Sink>(sink)),
        flat_(options.flat()),
        max_nesting_depth_(options.max_nesting_depth()),
        has_column_mapping_(!options.column_mapping().empty()),
        has_column_names_(!options.column_names().empty()),
        field_delimiter_(options.field_delimiter()),
        subfield_delimiter_(options.subfield_delimiter()),
        line_delimiter_(options.line_delimiter()),
        quote_style_(options.quote_style()),
        quote_char_(options.quote_char()),
        quote_escape_char_(options.quote_escape_char()),
        enable_nan_to_num_(options.enable_nan_to_num()),
        nan_to_num_(options.nan_to_num()),
        enable_nan_to_str_(options.enable_nan_to_str()),
        nan_to_str_(options.nan_to_str()),
        enable_inf_to_num_(options.enable_inf_to_num()),
        inf_to_num_(options.inf_to_num()),
        enable_inf_to_str_(options.enable_inf_to_str()),
        inf_to_str_(options.inf_to_str()),
        enable_neginf_to_num_(options.enable_neginf_to_num()),
        neginf_to_num_(options.neginf_to_num()),
        enable_neginf_to_str_(options.enable_neginf_to_str()),
        neginf_to_str_(options.neginf_to_str()),
        alloc_(alloc),
        stack_(alloc),
        fp_(options.float_format(), options.precision()),
        column_names_(alloc),
        column_paths_(alloc),
        column_path_name_map_(alloc),
        column_path_value_map_(alloc),
        column_path_column_map_(alloc),
        value_buffer_(alloc),
        column_it_(column_path_column_map_.end())
    {
        if (has_column_mapping_)
        {
            for (const auto& item : options.column_mapping())
            {
                column_paths_.emplace_back(item.first);
                column_path_name_map_.emplace(item.first, item.second);
                column_path_value_map_.emplace(item.first, string_type{alloc_});
            }
        }
        if (has_column_names_)
        {
            jsoncons::csv::detail::parse_column_names(options.column_names(), column_names_);
        }
    }